

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::default_cost_type<long_double>::make_l2_norm
          (default_cost_type<long_double> *this,int n)

{
  longdouble lVar1;
  longdouble *plVar2;
  ulong uVar3;
  long lVar4;
  longdouble lVar5;
  ulong local_18;
  ushort uStack_10;
  
  lVar5 = (longdouble)0;
  if (n != 0) {
    lVar5 = (longdouble)0;
    lVar4 = 0;
    do {
      lVar1 = *(longdouble *)
               ((long)(this->linear_elements)._M_t.
                      super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                      super__Head_base<0UL,_long_double_*,_false>._M_head_impl + lVar4);
      lVar5 = lVar1 * lVar1 + lVar5;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar4);
  }
  uStack_10 = (ushort)((unkuint10)lVar5 >> 0x40);
  local_18 = SUB108(lVar5,0);
  uVar3 = (ulong)uStack_10 & 0x7fff;
  if (n != 0 && (((~((byte)((unkuint10)lVar5 >> 0x38) >> 7 ^ ((unkuint10)lVar5 & 0x7fff) == 0) & 1)
                  == 0 && (SBORROW8(0x7fff,uVar3) !=
                          SBORROW8(0x7fff - uVar3,(ulong)(0x8000000000000000 < local_18))) ==
                          (long)((0x7fff - uVar3) - (ulong)(0x8000000000000000 < local_18)) < 0) &&
                ((ulong)(local_18 - 1 < 0x7fffffffffffffff) <= (uVar3 - 1) + (ulong)(local_18 != 0)
                && ((local_18 != 0x8000000000000000 || uVar3 != 0x7fff) &&
                   (local_18 != 0 || (ulong)uStack_10 != 0))))) {
    plVar2 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
             super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
    lVar4 = 0;
    do {
      *(longdouble *)((long)plVar2 + lVar4) = *(longdouble *)((long)plVar2 + lVar4) / lVar5;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar4);
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }